

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

CPrintVisitor * __thiscall CPrintVisitor::GetResult_abi_cxx11_(CPrintVisitor *this)

{
  string local_38 [40];
  CPrintVisitor *this_local;
  
  this_local = this;
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "digraph G{\ngraph[ordering=\"out\"];\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string CPrintVisitor::GetResult() {
	return "digraph G{\ngraph[ordering=\"out\"];\n" + description + "}\n";
}